

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O3

void __thiscall RealTrafficConnection::tcpConnection(RealTrafficConnection *this)

{
  TCPConnection *this_00;
  bool bVar1;
  uint _port;
  string local_60;
  ThreadSettings TS;
  
  ThreadSettings::ThreadSettings(&TS,"LT_RT_TCP",0x1fbf,"C");
  this->eTcpThrStatus = THR_RUNNING;
  _port = DataRefs::GetCfgInt(DR_CFG_RT_LISTEN_PORT);
  this_00 = &this->tcpPosSender;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"0.0.0.0","");
  XPMP2::SocketNetworking::Open(&this_00->super_SocketNetworking,&local_60,_port,0x2000,0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((int)dataRefs.iLogLevel < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
           ,0x636,"tcpConnection",logDEBUG,
           "RealTraffic: Listening on port %d for TCP connection by RealTraffic App",(ulong)_port);
  }
  bVar1 = XPMP2::TCPConnection::listenAccept(this_00,1);
  if (bVar1) {
    if ((int)dataRefs.iLogLevel < 1) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x639,"tcpConnection",logDEBUG,
             "RealTraffic: Accepted TCP connection from RealTraffic App");
    }
    SetStatusTcp(this,true,false);
    SendXPSimTime(this);
    SendUsersPlanePos(this);
  }
  else if ((int)this->eTcpThrStatus < 3) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x644,"tcpConnection",logERR,
             "RealTraffic: Cannot listen to network, can\'t tell RealTraffic our position");
    }
    CreateMsgWindow(12.0,logERR,
                    "RealTraffic: Cannot listen to network, can\'t tell RealTraffic our position");
    SetStatusTcp(this,false,true);
  }
  XPMP2::TCPConnection::CloseListenerOnly(this_00);
  this->eTcpThrStatus = THR_ENDED;
  ThreadSettings::~ThreadSettings(&TS);
  return;
}

Assistant:

void RealTrafficConnection::tcpConnection ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_RT_TCP", LC_ALL_MASK);
    eTcpThrStatus = THR_RUNNING;
    
    // port to use is configurable
    int tcpPort = DataRefs::GetCfgInt(DR_CFG_RT_LISTEN_PORT);
    
    try {
        tcpPosSender.Open (RT_LOCALHOST, tcpPort, RT_NET_BUF_SIZE);
        LOG_MSG(logDEBUG, "RealTraffic: Listening on port %d for TCP connection by RealTraffic App", tcpPort);
        if (tcpPosSender.listenAccept()) {
            // so we did accept a connection!
            LOG_MSG(logDEBUG, "RealTraffic: Accepted TCP connection from RealTraffic App");
            SetStatusTcp(true, false);
            // send our simulated time and first position
            SendXPSimTime();
            SendUsersPlanePos();
        }
        else
        {
            // short-cut if we are to shut down (return from 'select' due to closed socket)
            if (eTcpThrStatus < THR_STOP) {
                // not forced to shut down...report other problem
                SHOW_MSG(logERR,ERR_RT_CANTLISTEN);
                SetStatusTcp(false, true);
            }
        }
    }
    catch (std::runtime_error& e) {
        LOG_MSG(logERR, ERR_TCP_LISTENACCEPT, ChName(),
                RT_LOCALHOST, std::to_string(tcpPort).c_str(),
                e.what());
        // invalidate the channel
        SetStatusTcp(false, true);
        SetValid(false, true);
    }
    
    // We make sure that, once leaving this thread, there is no
    // open listener (there might be a connected socket, though)
#if IBM
    if (eTcpThrStatus < THR_STOP)   // already closed if stop flag set, avoid rare crashes if called in parallel
#endif
        tcpPosSender.CloseListenerOnly();
    eTcpThrStatus = THR_ENDED;
}